

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteCell(FILE *pFile)

{
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".model cell\n");
  fprintf((FILE *)pFile,".inputs px1 px2 py1 py2 x y\n");
  fprintf((FILE *)pFile,".outputs fx fy\n");
  fprintf((FILE *)pFile,".names x y a\n");
  fprintf((FILE *)pFile,"11 1\n");
  fprintf((FILE *)pFile,".names px1 a x nx\n");
  fprintf((FILE *)pFile,"11- 1\n");
  fprintf((FILE *)pFile,"0-1 1\n");
  fprintf((FILE *)pFile,".names py1 a y ny\n");
  fprintf((FILE *)pFile,"11- 1\n");
  fprintf((FILE *)pFile,"0-1 1\n");
  fprintf((FILE *)pFile,".names px2 nx fx\n");
  fprintf((FILE *)pFile,"10 1\n");
  fprintf((FILE *)pFile,"01 1\n");
  fprintf((FILE *)pFile,".names py2 ny fy\n");
  fprintf((FILE *)pFile,"10 1\n");
  fprintf((FILE *)pFile,"01 1\n");
  fprintf((FILE *)pFile,".end\n");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Abc_WriteCell( FILE * pFile )
{
    fprintf( pFile, ".model cell\n" );
    fprintf( pFile, ".inputs px1 px2 py1 py2 x y\n" ); 
    fprintf( pFile, ".outputs fx fy\n" ); 
    fprintf( pFile, ".names x y a\n" ); 
    fprintf( pFile, "11 1\n" ); 
    fprintf( pFile, ".names px1 a x nx\n" ); 
    fprintf( pFile, "11- 1\n" ); 
    fprintf( pFile, "0-1 1\n" ); 
    fprintf( pFile, ".names py1 a y ny\n" ); 
    fprintf( pFile, "11- 1\n" ); 
    fprintf( pFile, "0-1 1\n" ); 
    fprintf( pFile, ".names px2 nx fx\n" ); 
    fprintf( pFile, "10 1\n" ); 
    fprintf( pFile, "01 1\n" ); 
    fprintf( pFile, ".names py2 ny fy\n" ); 
    fprintf( pFile, "10 1\n" ); 
    fprintf( pFile, "01 1\n" ); 
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}